

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbcursor.cpp
# Opt level: O3

void __thiscall QFbCursor::setPos(QFbCursor *this,QPoint *pos)

{
  char cVar1;
  QPoint *pQVar2;
  long in_FS_OFFSET;
  QRect QVar3;
  QRect local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QPoint *)QGuiApplicationPrivate::inputDeviceManager();
  QInputDeviceManager::setCursorPos(pQVar2);
  QVar3.x2.m_i = local_28.x2.m_i;
  QVar3.y2.m_i = local_28.y2.m_i;
  QVar3.x1.m_i = local_28.x1.m_i;
  QVar3.y1.m_i = local_28.y1.m_i;
  *(QPoint *)(this + 0x58) = *pos;
  if (this[0x10] == (QFbCursor)0x1) {
    QVar3 = getCurrentRect(this);
    *(QRect *)(this + 0x20) = QVar3;
    if (this[0x41] == (QFbCursor)0x0) {
      local_28 = (QRect)(**(code **)(**(long **)(this + 0x18) + 0x68))();
      (**(code **)(**(long **)(this + 0x18) + 0x68))();
      cVar1 = QRect::intersects(&local_28);
      QVar3 = local_28;
      if (cVar1 == '\0') goto LAB_0011bbaf;
    }
    (**(code **)(*(long *)this + 0xa0))(this);
    QVar3 = local_28;
  }
LAB_0011bbaf:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  local_28 = QVar3;
  __stack_chk_fail();
}

Assistant:

void QFbCursor::setPos(const QPoint &pos)
{
    QGuiApplicationPrivate::inputDeviceManager()->setCursorPos(pos);
    m_pos = pos;
    if (!mVisible)
        return;
    mCurrentRect = getCurrentRect();
    if (mOnScreen || mScreen->geometry().intersects(mCurrentRect.translated(mScreen->geometry().topLeft())))
        setDirty();
}